

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O3

void mxx::impl::gatherv_big<char>
               (char *data,size_t size,char *out,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,int root,comm *comm
               )

{
  MPI_Comm poVar1;
  MPI_Datatype poVar2;
  comm *pcVar3;
  MPI_Request *ppoVar4;
  ulong uVar5;
  long lVar6;
  datatype dt_1;
  datatype dt;
  requests reqs;
  datatype local_90;
  datatype local_78;
  requests local_60;
  comm *local_40;
  ulong local_38;
  
  local_60._vptr_requests = (_func_int **)&PTR__requests_001ab080;
  local_60.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (comm->m_rank == root) {
    if (0 < comm->m_size) {
      uVar5 = 0;
      lVar6 = 0;
      local_40 = comm;
      local_38 = (ulong)(uint)root;
      do {
        pcVar3 = local_40;
        local_90._vptr_datatype = (_func_int **)&PTR__datatype_001aaf70;
        local_90.mpitype = (MPI_Datatype)&ompi_mpi_char;
        local_90.builtin = true;
        datatype::contiguous
                  (&local_78,&local_90,
                   (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar5]);
        datatype::~datatype(&local_90);
        poVar2 = local_78.mpitype;
        if (local_38 == uVar5) {
          if (size != 0) {
            memmove(out + lVar6,data,size);
          }
        }
        else {
          poVar1 = pcVar3->mpi_comm;
          ppoVar4 = requests::add(&local_60);
          MPI_Irecv(out + lVar6,1,poVar2,uVar5 & 0xffffffff,0x4d2,poVar1,ppoVar4);
        }
        lVar6 = lVar6 + (recv_sizes->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar5];
        datatype::~datatype(&local_78);
        uVar5 = uVar5 + 1;
      } while ((long)uVar5 < (long)local_40->m_size);
    }
  }
  else {
    local_90._vptr_datatype = (_func_int **)&PTR__datatype_001aaf70;
    local_90.mpitype = (MPI_Datatype)&ompi_mpi_char;
    local_90.builtin = true;
    datatype::contiguous(&local_78,&local_90,size);
    datatype::~datatype(&local_90);
    poVar1 = comm->mpi_comm;
    ppoVar4 = requests::add(&local_60);
    MPI_Isend(data,1,local_78.mpitype,(ulong)(uint)root,0x4d2,poVar1,ppoVar4);
    datatype::~datatype(&local_78);
  }
  MPI_Waitall((ulong)((long)local_60.m_requests.
                            super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_60.m_requests.
                           super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3,
              local_60.m_requests.
              super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
              super__Vector_impl_data._M_start,0);
  requests::~requests(&local_60);
  return;
}

Assistant:

void gatherv_big(const T* data, size_t size, T* out, const std::vector<size_t>& recv_sizes, int root, const mxx::comm& comm = mxx::comm()) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::requests reqs;
    int tag = 1234; // TODO: handle tags somewhere (as attributes in the comm?)
    if (comm.rank() == root) {
        size_t offset = 0;
        for (int i = 0; i < comm.size(); ++i) {
            mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_sizes[i]);
            if (i == root) {
                // copy input into output
                std::copy(data, data+size, out+offset);
            } else {
                MPI_Irecv(const_cast<T*>(out)+offset, 1, dt.type(), i, tag, comm, &reqs.add());
            }
            offset += recv_sizes[i];
        }
    } else {
        // create custom datatype to encapsulate the whole message
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
        MPI_Isend(const_cast<T*>(data), 1, dt.type(), root, tag, comm, &reqs.add());
    }
    reqs.wait();
}